

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int string_to_size(char *string,size_t *numberp)

{
  int *piVar1;
  sbyte local_34;
  size_t *psStack_30;
  uint shift;
  char *end;
  uintmax_t number;
  size_t *numberp_local;
  char *string_local;
  
  local_34 = 0;
  if (((string == (char *)0x0) || (*string == '\0')) || (*string == '-')) {
    string_local._4_4_ = -0x14;
  }
  else {
    number = (uintmax_t)numberp;
    numberp_local = (size_t *)string;
    end = (char *)strtoumax(string,(char **)&stack0xffffffffffffffd0,10);
    if (numberp_local < psStack_30) {
      if (((char)*psStack_30 == 'K') || ((char)*psStack_30 == 'k')) {
        psStack_30 = (size_t *)((long)psStack_30 + 1);
        local_34 = 10;
      }
      else if (((char)*psStack_30 == 'M') || ((char)*psStack_30 == 'm')) {
        psStack_30 = (size_t *)((long)psStack_30 + 1);
        local_34 = 0x14;
      }
      else if (((char)*psStack_30 == 'G') || (local_34 = 0, (char)*psStack_30 == 'g')) {
        local_34 = 0x1e;
        psStack_30 = (size_t *)((long)psStack_30 + 1);
      }
      if (((char)*psStack_30 == 'B') || ((char)*psStack_30 == 'b')) {
        psStack_30 = (size_t *)((long)psStack_30 + 1);
      }
    }
    if (((psStack_30 == numberp_local) || ((char)*psStack_30 != '\0')) ||
       (piVar1 = __errno_location(), *piVar1 == 0x4b)) {
      string_local._4_4_ = -0x14;
    }
    else if ((char *)(0xffffffffffffffffU >> local_34) < end) {
      string_local._4_4_ = -0x14;
    }
    else {
      *(long *)number = (long)end << local_34;
      string_local._4_4_ = 0;
    }
  }
  return string_local._4_4_;
}

Assistant:

static int
string_to_size(const char *string, size_t *numberp)
{
	uintmax_t number;
	char *end;
	unsigned int shift = 0;

	if (string == NULL || *string == '\0' || *string == '-')
		return (ARCHIVE_WARN);
	number = strtoumax(string, &end, 10);
	if (end > string) {
		if (*end == 'K' || *end == 'k') {
			shift = 10;
			end++;
		} else if (*end == 'M' || *end == 'm') {
			shift = 20;
			end++;
		} else if (*end == 'G' || *end == 'g') {
			shift = 30;
			end++;
		}
		if (*end == 'B' || *end == 'b') {
			end++;
		}
	}
	if (end == string || *end != '\0' || errno == EOVERFLOW) {
		return (ARCHIVE_WARN);
	}
	if (number > (uintmax_t)SIZE_MAX >> shift) {
		return (ARCHIVE_WARN);
	}
	*numberp = (size_t)(number << shift);
	return (ARCHIVE_OK);
}